

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::DiscMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  byte bVar14;
  Scene *pSVar15;
  undefined4 uVar16;
  undefined8 unaff_R12;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar32;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar33 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar50 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_1c0;
  float local_1bc;
  RayQueryContext *local_1b8;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  Scene *local_178;
  RTCFilterFunctionNArguments local_170;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0 [4];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80 [4];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar15 = context->scene;
  pGVar4 = (pSVar15->geometries).items[Disc->sharedGeomID].ptr;
  lVar5 = *(long *)&pGVar4->field_0x58;
  _Var6 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar18._16_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[4] * _Var6);
  auVar18._0_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[0] * _Var6);
  auVar19._16_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[5] * _Var6);
  auVar19._0_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[1] * _Var6);
  auVar23._16_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[6] * _Var6);
  auVar23._0_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[2] * _Var6);
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[7] * _Var6);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar5 + (Disc->primIDs).field_0.i[3] * _Var6);
  auVar21 = vunpcklps_avx(auVar18,auVar23);
  auVar23 = vunpckhps_avx(auVar18,auVar23);
  auVar9 = vunpcklps_avx(auVar19,auVar33);
  auVar33 = vunpckhps_avx(auVar19,auVar33);
  auVar18 = vunpcklps_avx(auVar21,auVar9);
  auVar21 = vunpckhps_avx(auVar21,auVar9);
  auVar9 = vunpcklps_avx(auVar23,auVar33);
  local_130 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_140 = local_130;
  uVar16 = *(undefined4 *)&(ray->org).field_0;
  auVar24._4_4_ = uVar16;
  auVar24._0_4_ = uVar16;
  auVar24._8_4_ = uVar16;
  auVar24._12_4_ = uVar16;
  auVar24._16_4_ = uVar16;
  auVar24._20_4_ = uVar16;
  auVar24._24_4_ = uVar16;
  auVar24._28_4_ = uVar16;
  auVar18 = vsubps_avx(auVar18,auVar24);
  uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar20._4_4_ = uVar16;
  auVar20._0_4_ = uVar16;
  auVar20._8_4_ = uVar16;
  auVar20._12_4_ = uVar16;
  auVar20._16_4_ = uVar16;
  auVar20._20_4_ = uVar16;
  auVar20._24_4_ = uVar16;
  auVar20._28_4_ = uVar16;
  auVar19 = vsubps_avx(auVar21,auVar20);
  uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar21._4_4_ = uVar16;
  auVar21._0_4_ = uVar16;
  auVar21._8_4_ = uVar16;
  auVar21._12_4_ = uVar16;
  auVar21._16_4_ = uVar16;
  auVar21._20_4_ = uVar16;
  auVar21._24_4_ = uVar16;
  auVar21._28_4_ = uVar16;
  fVar1 = (ray->dir).field_0.m128[0];
  auVar20 = vsubps_avx(auVar9,auVar21);
  fVar2 = (ray->dir).field_0.m128[1];
  fVar3 = (ray->dir).field_0.m128[2];
  fVar57 = (ray->dir).field_0.m128[0];
  fVar22 = (ray->dir).field_0.m128[1];
  auVar48 = ZEXT416((uint)(fVar57 * fVar57 + fVar22 * fVar22 + fVar3 * fVar3));
  auVar48 = vshufps_avx(auVar48,auVar48,0);
  auVar50._16_16_ = auVar48;
  auVar50._0_16_ = auVar48;
  auVar21 = vrcpps_avx(auVar50);
  fVar3 = (ray->dir).field_0.m128[2];
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = &DAT_3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59._16_4_ = 0x3f800000;
  auVar59._20_4_ = 0x3f800000;
  auVar59._24_4_ = 0x3f800000;
  auVar59._28_4_ = 0x3f800000;
  fVar57 = auVar21._0_4_;
  fVar51 = auVar21._4_4_;
  auVar9._4_4_ = fVar51 * auVar48._4_4_;
  auVar9._0_4_ = fVar57 * auVar48._0_4_;
  fVar52 = auVar21._8_4_;
  auVar9._8_4_ = fVar52 * auVar48._8_4_;
  fVar53 = auVar21._12_4_;
  auVar9._12_4_ = fVar53 * auVar48._12_4_;
  fVar54 = auVar21._16_4_;
  auVar9._16_4_ = fVar54 * auVar48._0_4_;
  fVar55 = auVar21._20_4_;
  auVar9._20_4_ = fVar55 * auVar48._4_4_;
  fVar56 = auVar21._24_4_;
  auVar9._24_4_ = fVar56 * auVar48._8_4_;
  auVar9._28_4_ = auVar48._12_4_;
  auVar9 = vsubps_avx(auVar59,auVar9);
  fVar40 = auVar20._0_4_;
  fVar41 = auVar20._4_4_;
  fVar42 = auVar20._8_4_;
  fVar43 = auVar20._12_4_;
  fVar44 = auVar20._16_4_;
  fVar45 = auVar20._20_4_;
  fVar46 = auVar20._24_4_;
  fVar32 = auVar19._0_4_;
  fVar34 = auVar19._4_4_;
  fVar35 = auVar19._8_4_;
  fVar36 = auVar19._12_4_;
  fVar37 = auVar19._16_4_;
  fVar38 = auVar19._20_4_;
  fVar39 = auVar19._24_4_;
  fVar22 = auVar18._0_4_;
  fVar26 = auVar18._4_4_;
  fVar27 = auVar18._8_4_;
  fVar28 = auVar18._12_4_;
  fVar29 = auVar18._16_4_;
  fVar30 = auVar18._20_4_;
  fVar31 = auVar18._24_4_;
  fVar49 = (fVar22 * fVar1 + fVar32 * fVar2 + fVar40 * fVar3) * (fVar57 + fVar57 * auVar9._0_4_);
  fVar51 = (fVar26 * fVar1 + fVar34 * fVar2 + fVar41 * fVar3) * (fVar51 + fVar51 * auVar9._4_4_);
  local_e0._4_4_ = fVar51;
  local_e0._0_4_ = fVar49;
  fVar52 = (fVar27 * fVar1 + fVar35 * fVar2 + fVar42 * fVar3) * (fVar52 + fVar52 * auVar9._8_4_);
  local_e0._8_4_ = fVar52;
  fVar53 = (fVar28 * fVar1 + fVar36 * fVar2 + fVar43 * fVar3) * (fVar53 + fVar53 * auVar9._12_4_);
  local_e0._12_4_ = fVar53;
  fVar54 = (fVar29 * fVar1 + fVar37 * fVar2 + fVar44 * fVar3) * (fVar54 + fVar54 * auVar9._16_4_);
  local_e0._16_4_ = fVar54;
  fVar55 = (fVar30 * fVar1 + fVar38 * fVar2 + fVar45 * fVar3) * (fVar55 + fVar55 * auVar9._20_4_);
  local_e0._20_4_ = fVar55;
  fVar56 = (fVar31 * fVar1 + fVar39 * fVar2 + fVar46 * fVar3) * (fVar56 + fVar56 * auVar9._24_4_);
  local_e0._24_4_ = fVar56;
  local_e0._28_4_ = auVar21._28_4_ + auVar9._28_4_;
  uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar58._4_4_ = uVar16;
  auVar58._0_4_ = uVar16;
  auVar58._8_4_ = uVar16;
  auVar58._12_4_ = uVar16;
  auVar58._16_4_ = uVar16;
  auVar58._20_4_ = uVar16;
  auVar58._24_4_ = uVar16;
  auVar58._28_4_ = uVar16;
  auVar21 = vcmpps_avx(auVar58,local_e0,2);
  fVar57 = ray->tfar;
  auVar60._4_4_ = fVar57;
  auVar60._0_4_ = fVar57;
  auVar60._8_4_ = fVar57;
  auVar60._12_4_ = fVar57;
  auVar60._16_4_ = fVar57;
  auVar60._20_4_ = fVar57;
  auVar60._24_4_ = fVar57;
  auVar60._28_4_ = fVar57;
  auVar9 = vcmpps_avx(local_e0,auVar60,2);
  auVar21 = vandps_avx(auVar21,auVar9);
  auVar48 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar61._16_16_ = auVar48;
  auVar61._0_16_ = auVar48;
  auVar9 = vcvtdq2ps_avx(auVar61);
  auVar9 = vcmpps_avx(_DAT_02020f40,auVar9,1);
  auVar24 = auVar9 & auVar21;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar21 = vandps_avx(auVar21,auVar9);
    auVar24 = vunpckhps_avx(auVar23,auVar33);
    auVar10._4_4_ = fVar51 * fVar1;
    auVar10._0_4_ = fVar49 * fVar1;
    auVar10._8_4_ = fVar52 * fVar1;
    auVar10._12_4_ = fVar53 * fVar1;
    auVar10._16_4_ = fVar54 * fVar1;
    auVar10._20_4_ = fVar55 * fVar1;
    auVar10._24_4_ = fVar56 * fVar1;
    auVar10._28_4_ = auVar33._28_4_;
    auVar11._4_4_ = fVar51 * fVar2;
    auVar11._0_4_ = fVar49 * fVar2;
    auVar11._8_4_ = fVar52 * fVar2;
    auVar11._12_4_ = fVar53 * fVar2;
    auVar11._16_4_ = fVar54 * fVar2;
    auVar11._20_4_ = fVar55 * fVar2;
    auVar11._24_4_ = fVar56 * fVar2;
    auVar11._28_4_ = auVar9._28_4_;
    auVar13._4_4_ = fVar51 * fVar3;
    auVar13._0_4_ = fVar49 * fVar3;
    auVar13._8_4_ = fVar52 * fVar3;
    auVar13._12_4_ = fVar53 * fVar3;
    auVar13._16_4_ = fVar54 * fVar3;
    auVar13._20_4_ = fVar55 * fVar3;
    auVar13._24_4_ = fVar56 * fVar3;
    auVar13._28_4_ = DAT_02020f40._28_4_;
    auVar9 = vsubps_avx(auVar18,auVar10);
    auVar23 = vsubps_avx(auVar19,auVar11);
    auVar33 = vsubps_avx(auVar20,auVar13);
    auVar47._0_4_ =
         auVar23._0_4_ * auVar23._0_4_ + auVar33._0_4_ * auVar33._0_4_ + auVar9._0_4_ * auVar9._0_4_
    ;
    auVar47._4_4_ =
         auVar23._4_4_ * auVar23._4_4_ + auVar33._4_4_ * auVar33._4_4_ + auVar9._4_4_ * auVar9._4_4_
    ;
    auVar47._8_4_ =
         auVar23._8_4_ * auVar23._8_4_ + auVar33._8_4_ * auVar33._8_4_ + auVar9._8_4_ * auVar9._8_4_
    ;
    auVar47._12_4_ =
         auVar23._12_4_ * auVar23._12_4_ + auVar33._12_4_ * auVar33._12_4_ +
         auVar9._12_4_ * auVar9._12_4_;
    auVar47._16_4_ =
         auVar23._16_4_ * auVar23._16_4_ + auVar33._16_4_ * auVar33._16_4_ +
         auVar9._16_4_ * auVar9._16_4_;
    auVar47._20_4_ =
         auVar23._20_4_ * auVar23._20_4_ + auVar33._20_4_ * auVar33._20_4_ +
         auVar9._20_4_ * auVar9._20_4_;
    auVar47._24_4_ =
         auVar23._24_4_ * auVar23._24_4_ + auVar33._24_4_ * auVar33._24_4_ +
         auVar9._24_4_ * auVar9._24_4_;
    auVar47._28_4_ = auVar23._28_4_ + auVar33._28_4_ + auVar9._28_4_;
    auVar12._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar12._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar12._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar12._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar12._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar12._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar12._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar12._28_4_ = auVar24._28_4_;
    auVar9 = vcmpps_avx(auVar47,auVar12,2);
    auVar23 = auVar21 & auVar9;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar21 = vandps_avx(auVar21,auVar9);
      auVar25._0_4_ = fVar22 * fVar22 + fVar32 * fVar32 + fVar40 * fVar40;
      auVar25._4_4_ = fVar26 * fVar26 + fVar34 * fVar34 + fVar41 * fVar41;
      auVar25._8_4_ = fVar27 * fVar27 + fVar35 * fVar35 + fVar42 * fVar42;
      auVar25._12_4_ = fVar28 * fVar28 + fVar36 * fVar36 + fVar43 * fVar43;
      auVar25._16_4_ = fVar29 * fVar29 + fVar37 * fVar37 + fVar44 * fVar44;
      auVar25._20_4_ = fVar30 * fVar30 + fVar38 * fVar38 + fVar45 * fVar45;
      auVar25._24_4_ = fVar31 * fVar31 + fVar39 * fVar39 + fVar46 * fVar46;
      auVar25._28_4_ = auVar18._28_4_ + auVar19._28_4_ + auVar20._28_4_;
      auVar9 = vcmpps_avx(auVar25,auVar12,6);
      auVar18 = auVar21 & auVar9;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar21 = vandps_avx(auVar9,auVar21);
        local_100 = ZEXT432(0) << 0x20;
        local_120 = ZEXT432(0) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        local_a0[0] = -fVar2;
        local_a0[1] = -fVar2;
        local_a0[2] = -fVar2;
        local_a0[3] = -fVar2;
        fStack_90 = -fVar2;
        fStack_8c = -fVar2;
        fStack_88 = -fVar2;
        fStack_84 = -fVar2;
        local_80[0] = -fVar3;
        local_80[1] = -fVar3;
        local_80[2] = -fVar3;
        local_80[3] = -fVar3;
        fStack_70 = -fVar3;
        fStack_6c = -fVar3;
        fStack_68 = -fVar3;
        fStack_64 = -fVar3;
        uVar16 = vmovmskps_avx(auVar21);
        uVar17 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar16);
        local_1b8 = context;
        do {
          local_170.hit = (RTCHitN *)&local_1b0;
          uVar8 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          local_198 = *(uint *)(local_140 + uVar8 * 4);
          pGVar4 = (pSVar15->geometries).items[local_198].ptr;
          if ((pGVar4->mask & ray->mask) == 0) {
LAB_0109cf47:
            uVar17 = uVar17 ^ 1L << (uVar8 & 0x3f);
            bVar14 = 1;
          }
          else {
            if ((local_1b8->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1a4 = *(undefined4 *)(local_120 + uVar8 * 4);
              local_1a0 = *(undefined4 *)(local_100 + uVar8 * 4);
              local_19c = (Disc->primIDs).field_0.i[uVar8];
              local_1b0 = local_c0[uVar8];
              local_1ac = local_a0[uVar8];
              local_1a8 = local_80[uVar8];
              local_194 = local_1b8->user->instID[0];
              local_190 = local_1b8->user->instPrimID[0];
              local_1bc = ray->tfar;
              ray->tfar = local_c0[uVar8 - 8];
              local_1c0 = -1;
              local_170.geometryUserPtr = pGVar4->userPtr;
              local_170.context = local_1b8->user;
              local_170.N = 1;
              local_170.valid = &local_1c0;
              local_170.ray = (RTCRayN *)ray;
              if ((pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
                 (local_178 = pSVar15, local_170.valid = &local_1c0,
                 (*pGVar4->occlusionFilterN)(&local_170), pSVar15 = local_178, *local_170.valid == 0
                 )) {
LAB_0109d09c:
                ray->tfar = local_1bc;
                goto LAB_0109cf47;
              }
              p_Var7 = local_1b8->args->filter;
              if (p_Var7 != (RTCFilterFunctionN)0x0) {
                if (((local_1b8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var7)(&local_170);
                }
                if (*local_170.valid == 0) goto LAB_0109d09c;
              }
            }
            bVar14 = 0;
          }
          if ((bVar14 == 0) || (uVar17 == 0)) {
            return (bool)(bVar14 ^ 1);
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }